

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

size_t __thiscall
axl::sl::Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::copyReverse
          (Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *this,wchar_t *p,size_t count)

{
  bool bVar1;
  size_t in_RDX;
  Ptr<void> *in_RDI;
  bool result;
  Ptr<void> shadow;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  size_t in_stack_ffffffffffffffb0;
  wchar_t *in_stack_ffffffffffffffb8;
  BufHdr *in_stack_ffffffffffffffc0;
  size_t local_8;
  
  if (in_RDX == 0) {
    clear((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)0x13f91f);
    local_8 = 0;
  }
  else {
    rc::Ptr<void>::Ptr((Ptr<void> *)0x13f937);
    if ((in_RDI->m_refCount != (RefCount *)0x0) &&
       (in_stack_ffffffffffffff9f =
             rc::BufHdr::isInsideBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
       (bool)in_stack_ffffffffffffff9f)) {
      rc::Ptr<void>::Ptr<axl::rc::BufHdr>
                (in_RDI,(BufHdr *)
                        CONCAT17(in_stack_ffffffffffffff9f,
                                 CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
      rc::Ptr<void>::operator=
                (in_RDI,(Ptr<void> *)
                        CONCAT17(in_stack_ffffffffffffff9f,
                                 CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
      rc::Ptr<void>::~Ptr((Ptr<void> *)0x13f99a);
    }
    bVar1 = setCount((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)in_RDI,
                     CONCAT17(in_stack_ffffffffffffff9f,
                              CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
    if (bVar1) {
      ReverseArray<wchar_t>::copyReverse
                ((wchar_t *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
      local_8 = in_RDX;
    }
    else {
      local_8 = 0xffffffffffffffff;
    }
    rc::Ptr<void>::~Ptr((Ptr<void> *)0x13fa37);
  }
  return local_8;
}

Assistant:

size_t
	copyReverse(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copyReverse(this->m_p, p, count);
		return count;
	}